

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  uint val;
  uint uVar1;
  int iVar2;
  uint len;
  uint uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  int l;
  int local_b4;
  xmlXPathParserContextPtr local_b0;
  xmlChar buf [105];
  
  val = xmlXPathCurrentChar(ctxt,&l);
  if ((val - 0x20 < 0x3e) && ((0x2800000140008401U >> ((ulong)(val - 0x20) & 0x3f) & 1) != 0)) {
    return (xmlChar *)0x0;
  }
  if (val < 0x100) {
    if ((((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val != 0x5f)) && (val < 0xf8)) &&
       ((0x1e < val - 0xd8 && (val != 0x3a || qualified == 0)))) {
      return (xmlChar *)0x0;
    }
  }
  else {
    iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
    if ((iVar2 == 0) && ((val - 0x302a < 0xfffffff7 && val - 0x9fa6 < 0xffffae5a) && val != 0x3007))
    {
      return (xmlChar *)0x0;
    }
  }
  len = 0;
  local_b4 = qualified;
  do {
    if ((val < 0x3f) && ((0x4000800100000000U >> ((ulong)val & 0x3f) & 1) != 0)) {
LAB_001b84cf:
      if (len == 0) {
        return (xmlChar *)0x0;
      }
      pxVar4 = xmlStrndup(buf,len);
      if (pxVar4 != (xmlChar *)0x0) {
        return pxVar4;
      }
      goto LAB_001b8736;
    }
    if (val < 0x100) {
      if (val - 0xc0 < 0x17 || (val & 0xdf) - 0x41 < 0x1a) {
LAB_001b839d:
        if (val < 0x80) goto LAB_001b844e;
      }
      else if (val < 0xf8 && 0x1e < val - 0xd8) {
        if (9 < val - 0x30) goto LAB_001b8435;
        goto LAB_001b844e;
      }
LAB_001b8417:
      iVar2 = xmlCopyCharMultiByte(buf + (int)len,val);
      len = len + iVar2;
    }
    else {
      iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (((iVar2 != 0) || ((val - 0x3021 < 9 || val - 0x4e00 < 0x51a6) || val == 0x3007)) ||
         (iVar2 = xmlCharInRange(val,&xmlIsDigitGroup), iVar2 != 0)) goto LAB_001b8417;
LAB_001b8435:
      if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
         (local_b4 == 0 || val != 0x3a)) {
        if (val < 0x100) {
          uVar1 = (uint)(val == 0xb7);
        }
        else {
          iVar2 = xmlCharInRange(val,&xmlIsCombiningGroup);
          if (iVar2 != 0) goto LAB_001b8417;
          uVar1 = xmlCharInRange(val,&xmlIsExtenderGroup);
        }
        if (uVar1 == 0) goto LAB_001b84cf;
        goto LAB_001b839d;
      }
LAB_001b844e:
      buf[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    ctxt->cur = ctxt->cur + l;
    val = xmlXPathCurrentChar(ctxt,&l);
  } while ((int)len < 100);
  if (50000 < len) {
    xmlXPathErr(ctxt,7);
    return (xmlChar *)0x0;
  }
  uVar1 = len * 2;
  pxVar4 = (xmlChar *)(*xmlMalloc)((size_t)uVar1);
  if (pxVar4 != (xmlChar *)0x0) {
    memcpy(pxVar4,buf,(ulong)len);
    local_b0 = ctxt;
    do {
      if (val < 0x100) {
        if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) &&
           ((9 < val - 0x30 && 0x1e < val - 0xd8) && val < 0xf8)) {
LAB_001b85ed:
          if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0))
             && (local_b4 == 0 || val != 0x3a)) {
            if (val < 0x100) {
              uVar3 = (uint)(val == 0xb7);
            }
            else {
              iVar2 = xmlCharInRange(val,&xmlIsCombiningGroup);
              if (iVar2 != 0) goto LAB_001b860e;
              uVar3 = xmlCharInRange(val,&xmlIsExtenderGroup);
            }
            if (uVar3 == 0) {
              pxVar4[(int)len] = '\0';
              return pxVar4;
            }
          }
        }
      }
      else {
        iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
        if (((iVar2 == 0) && ((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007)) &&
           (iVar2 = xmlCharInRange(val,&xmlIsDigitGroup), iVar2 == 0)) goto LAB_001b85ed;
      }
LAB_001b860e:
      pxVar5 = pxVar4;
      if ((int)uVar1 < (int)(len + 10)) {
        uVar3 = 1;
        if (0 < (int)uVar1) {
          if (49999 < uVar1) goto LAB_001b8725;
          uVar6 = uVar1 + 1 >> 1;
          uVar3 = uVar6 + uVar1;
          if (50000 - uVar6 < uVar1) {
            uVar3 = 50000;
          }
        }
        uVar1 = uVar3;
        pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,(size_t)uVar1);
        if (pxVar5 == (xmlChar *)0x0) goto LAB_001b8725;
      }
      pxVar4 = pxVar5;
      if (val < 0x80) {
        pxVar4[(int)len] = (xmlChar)val;
        len = len + 1;
      }
      else {
        iVar2 = xmlCopyCharMultiByte(pxVar4 + (int)len,val);
        len = iVar2 + len;
      }
      local_b0->cur = local_b0->cur + l;
      val = xmlXPathCurrentChar(local_b0,&l);
    } while( true );
  }
LAB_001b8736:
  xmlXPathPErrMemory(ctxt);
  return (xmlChar *)0x0;
LAB_001b8725:
  (*xmlFree)(pxVar4);
  ctxt = local_b0;
  goto LAB_001b8736;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar *ret;
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
                xmlXPathPErrMemory(ctxt);
                return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_NAME_LENGTH);
                    if (newSize < 0) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
		    }
                    buffer = tmp;
		    max = newSize;
		}
		COPY_BUF(buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    return(ret);
}